

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl.cc
# Opt level: O1

int __thiscall
google::protobuf::io::FileInputStream::CopyingFileInputStream::Skip
          (CopyingFileInputStream *this,int count)

{
  int iVar1;
  LogMessage *other;
  __off_t _Var2;
  LogFinisher local_59;
  LogMessage local_58;
  
  if (this->is_closed_ == true) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/io/zero_copy_stream_impl.cc"
               ,0x94);
    other = internal::LogMessage::operator<<(&local_58,"CHECK failed: !is_closed_: ");
    internal::LogFinisher::operator=(&local_59,other);
    internal::LogMessage::~LogMessage(&local_58);
  }
  if ((this->previous_seek_failed_ == false) &&
     (_Var2 = lseek(this->file_,(long)count,1), _Var2 != -1)) {
    return count;
  }
  this->previous_seek_failed_ = true;
  iVar1 = CopyingInputStream::Skip(&this->super_CopyingInputStream,count);
  return iVar1;
}

Assistant:

int FileInputStream::CopyingFileInputStream::Skip(int count) {
  GOOGLE_CHECK(!is_closed_);

  if (!previous_seek_failed_ && lseek(file_, count, SEEK_CUR) != (off_t)-1) {
    // Seek succeeded.
    return count;
  } else {
    // Failed to seek.

    // Note to self:  Don't seek again.  This file descriptor doesn't
    // support it.
    previous_seek_failed_ = true;

    // Use the default implementation.
    return CopyingInputStream::Skip(count);
  }
}